

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

void stb__sha1(stb_uchar *chunk,stb_uint *h)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  stb_uint sVar5;
  uint uVar6;
  uint uVar7;
  stb_uint sVar8;
  stb_uint sVar9;
  uint auStack_1a8 [8];
  uint auStack_188 [5];
  uint auStack_174 [83];
  
  lVar1 = 0;
  do {
    uVar2 = *(uint *)(chunk + lVar1 * 4);
    auStack_174[lVar1 + 3] =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  lVar1 = 0x10;
  do {
    uVar2 = auStack_188[lVar1] ^ auStack_174[lVar1] ^ auStack_1a8[lVar1 + 2] ^ auStack_1a8[lVar1];
    auStack_174[lVar1 + 3] = uVar2 << 1 | (uint)((int)uVar2 < 0);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x50);
  lVar1 = 0;
  uVar2 = *h;
  uVar3 = h[1];
  sVar9 = h[2];
  sVar8 = h[3];
  sVar5 = h[4];
  do {
    uVar6 = sVar8;
    sVar8 = sVar9;
    uVar4 = uVar2;
    uVar2 = auStack_174[lVar1 + 3] +
            ((sVar8 ^ uVar6) & uVar3 ^ uVar6) + (uVar4 << 5 | uVar4 >> 0x1b) + sVar5 + 0x5a827999;
    sVar9 = uVar3 << 0x1e | uVar3 >> 2;
    lVar1 = lVar1 + 1;
    uVar3 = uVar4;
    sVar5 = uVar6;
  } while (lVar1 != 0x14);
  lVar1 = 0x14;
  do {
    uVar7 = sVar8;
    sVar8 = sVar9;
    uVar3 = uVar2;
    uVar2 = auStack_174[lVar1 + 3] + (sVar8 ^ uVar7 ^ uVar4) + uVar6 + (uVar3 << 5 | uVar3 >> 0x1b)
            + 0x6ed9eba1;
    sVar9 = uVar4 << 0x1e | uVar4 >> 2;
    lVar1 = lVar1 + 1;
    uVar4 = uVar3;
    uVar6 = uVar7;
  } while (lVar1 != 0x28);
  lVar1 = 0x28;
  do {
    uVar6 = sVar8;
    sVar8 = sVar9;
    uVar4 = uVar2;
    uVar2 = auStack_174[lVar1 + 3] +
            ((uVar3 ^ sVar8) & uVar6) + (uVar3 & sVar8) + uVar7 + (uVar4 << 5 | uVar4 >> 0x1b) +
            0x8f1bbcdc;
    sVar9 = uVar3 << 0x1e | uVar3 >> 2;
    lVar1 = lVar1 + 1;
    uVar3 = uVar4;
    uVar7 = uVar6;
  } while (lVar1 != 0x3c);
  lVar1 = 0x3c;
  do {
    uVar7 = sVar8;
    sVar8 = sVar9;
    uVar3 = uVar2;
    uVar2 = auStack_174[lVar1 + 3] + (sVar8 ^ uVar7 ^ uVar4) + uVar6 + (uVar3 << 5 | uVar3 >> 0x1b)
            + 0xca62c1d6;
    sVar9 = uVar4 << 0x1e | uVar4 >> 2;
    lVar1 = lVar1 + 1;
    uVar4 = uVar3;
    uVar6 = uVar7;
  } while (lVar1 != 0x50);
  *h = uVar2 + *h;
  h[1] = uVar3 + h[1];
  h[2] = sVar9 + h[2];
  h[3] = sVar8 + h[3];
  h[4] = uVar7 + h[4];
  return;
}

Assistant:

static void stb__sha1(stb_uchar *chunk, stb_uint h[5])
{
   int i;
   stb_uint a,b,c,d,e;
   stb_uint w[80];

   for (i=0; i < 16; ++i)
      w[i] = stb_big32(&chunk[i*4]);
   for (i=16; i < 80; ++i) {
      stb_uint t;
      t = w[i-3] ^ w[i-8] ^ w[i-14] ^ w[i-16];
      w[i] = (t + t) | (t >> 31);
   }

   a = h[0];
   b = h[1];
   c = h[2];
   d = h[3];
   e = h[4];

   #define STB__SHA1(k,f)                                            \
   {                                                                 \
      stb_uint temp = (a << 5) + (a >> 27) + (f) + e + (k) + w[i];  \
      e = d;                                                       \
      d = c;                                                     \
      c = (b << 30) + (b >> 2);                               \
      b = a;                                              \
      a = temp;                                    \
   }

   i=0;
   for (; i < 20; ++i) STB__SHA1(0x5a827999, d ^ (b & (c ^ d))       );
   for (; i < 40; ++i) STB__SHA1(0x6ed9eba1, b ^ c ^ d               );
   for (; i < 60; ++i) STB__SHA1(0x8f1bbcdc, (b & c) + (d & (b ^ c)) );
   for (; i < 80; ++i) STB__SHA1(0xca62c1d6, b ^ c ^ d               );

   #undef STB__SHA1

   h[0] += a;
   h[1] += b;
   h[2] += c;
   h[3] += d;
   h[4] += e;
}